

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Options::Options
          (Options *this,FileOptions *fileOptions,Scrubber *scrubber,Reporter *reporter,
          bool usingDefaultScrubber,shared_ptr<ApprovalTests::ApprovalNamer> *namer)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  FileOptions *in_RDX;
  long in_RDI;
  byte in_R8B;
  FileOptions *in_R9;
  
  FileOptions::FileOptions(in_R9,in_RDX);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_R9,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)in_RDX);
  *(ulong *)(in_RDI + 0x48) = CONCAT71(in_register_00000009,in_CL);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)in_R9,
             (shared_ptr<ApprovalTests::ApprovalNamer> *)in_RDX);
  *(byte *)(in_RDI + 0x60) = in_R8B & 1;
  return;
}

Assistant:

Options::Options(Options::FileOptions fileOptions,
                     Scrubber scrubber,
                     const Reporter& reporter,
                     bool usingDefaultScrubber,
                     std::shared_ptr<ApprovalNamer> namer)
        : fileOptions_(std::move(fileOptions))
        , scrubber_(std::move(scrubber))
        , reporter_(reporter)
        , namer_(namer)
        , usingDefaultScrubber_(usingDefaultScrubber)
    {
    }